

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O1

void __thiscall Assimp::BaseImporter::~BaseImporter(BaseImporter *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  this->_vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_008ebe38;
  pcVar2 = (this->m_ErrorText)._M_dataplus._M_p;
  paVar1 = &(this->m_ErrorText).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<Assimp::BaseImporter::ImporterUnits,_std::pair<const_Assimp::BaseImporter::ImporterUnits,_double>,_std::_Select1st<std::pair<const_Assimp::BaseImporter::ImporterUnits,_double>_>,_std::less<Assimp::BaseImporter::ImporterUnits>,_std::allocator<std::pair<const_Assimp::BaseImporter::ImporterUnits,_double>_>_>
  ::~_Rb_tree(&(this->importerUnits)._M_t);
  return;
}

Assistant:

BaseImporter::~BaseImporter() {
    // nothing to do here
}